

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O3

int __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_>::closer
          (miller_spectral_canonization_impl<kitty::static_truth_table<4U,_true>_> *this,UI *ui)

{
  uint uVar1;
  pointer psVar2;
  uint uVar3;
  int extraout_EAX;
  ulong uVar4;
  uint uVar5;
  spectral_operation *t;
  pointer psVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar4 = *(ulong *)ui;
  if (*(long *)(ui + 8) - uVar4 != 0) {
    uVar10 = 1;
    uVar9 = 0;
    do {
      uVar8 = uVar10;
      uVar10 = (ulong)(this->order).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar9];
      uVar5 = *(uint *)(uVar4 + uVar10 * 4);
      uVar1 = (this->best_spec)._s.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      if (uVar5 != uVar1) {
        uVar3 = -uVar5;
        if (0 < (int)uVar5) {
          uVar3 = uVar5;
        }
        uVar7 = -uVar1;
        if (0 < (int)uVar1) {
          uVar7 = uVar1;
        }
        if (uVar7 < uVar3) goto LAB_00106d2d;
        if (uVar3 == uVar7) {
          if ((int)uVar1 < (int)uVar5) goto LAB_00106d2d;
          if ((int)uVar5 < (int)uVar1) goto LAB_00106d34;
        }
        else if (uVar3 < uVar7) goto LAB_00106d34;
      }
      uVar10 = (ulong)((int)uVar8 + 1);
      uVar9 = uVar8;
    } while (uVar8 < (ulong)((long)(*(long *)(ui + 8) - uVar4) >> 2));
  }
  psVar6 = (this->transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  uVar5 = 0;
  if (psVar6 != psVar2) {
    uVar5 = 0;
    do {
      uVar5 = uVar5 + (uint)(psVar6->_kind == permutation) * 2 + 1;
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar2);
  }
  psVar6 = (this->best_transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->best_transforms).
           super__Vector_base<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar2) {
    uVar4 = 0;
    do {
      uVar4 = (ulong)((int)uVar4 + (uint)(psVar6->_kind == permutation) * 2 + 1);
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar2);
  }
  if ((uint)uVar4 <= uVar5) {
LAB_00106d34:
    return (int)uVar4;
  }
LAB_00106d2d:
  update_best(this,(spectrum *)ui);
  return extraout_EAX;
}

Assistant:

void closer( spectrum& lspec )
  {
    for ( auto i = 0u; i < lspec.size(); ++i )
    {
      const auto j = order[i];
      if ( lspec[j] == best_spec[j] )
      {
        continue;
      }
      if ( abs( lspec[j] ) > abs( best_spec[j] ) ||
           ( abs( lspec[j] ) == abs( best_spec[j] ) && lspec[j] > best_spec[j] ) )
      {
        update_best( lspec );
        return;
      }

      if ( abs( lspec[j] ) < abs( best_spec[j] ) ||
           ( abs( lspec[j] ) == abs( best_spec[j] ) && lspec[j] < best_spec[j] ) )
      {
        return;
      }
    }

    if ( transformation_costs( transforms ) < transformation_costs( best_transforms ) )
    {
      update_best( lspec );
    }
  }